

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O3

void ht_tcp_server_write(HT_TCPServer *server,char *buffer,size_t size)

{
  int __fd;
  ssize_t sVar1;
  ulong uVar2;
  size_t n;
  
  ht_mutex_lock(server->client_mutex);
  if ((server->client_sock_fd).size != 0) {
    n = 0;
    do {
      if (size != 0) {
        __fd = (server->client_sock_fd).data[n];
        uVar2 = 0;
        do {
          if (size < uVar2 || size - uVar2 == 0) goto LAB_0010a16c;
          sVar1 = send(__fd,buffer + uVar2,size - uVar2,0);
          uVar2 = uVar2 + ((uint)sVar1 & 0x7fffffff);
        } while (0 < (int)(uint)sVar1);
        ht_bag_int_remove_nth(&server->client_sock_fd,n);
        n = n - 1;
      }
LAB_0010a16c:
      n = n + 1;
    } while (n < (server->client_sock_fd).size);
  }
  ht_mutex_unlock(server->client_mutex);
  return;
}

Assistant:

void
ht_tcp_server_write(HT_TCPServer* server, char* buffer, size_t size)
{
    size_t i;

    ht_mutex_lock(server->client_mutex);

    for (i = 0; i < ht_bag_size(server->client_sock_fd); i++)
    {
        if (!ht_tcp_server_write_to_socket(server, ht_bag_nth(server->client_sock_fd, i), buffer, size))
        {
            ht_bag_int_remove_nth(&server->client_sock_fd, i);
            i--;
        }
    }

    ht_mutex_unlock(server->client_mutex);
}